

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Induction.cpp
# Opt level: O2

void __thiscall
Inferences::InductionClauseIterator::resolveClauses
          (InductionClauseIterator *this,InductionContext *context,Entry *e,
          TermLiteralClause *bound1,TermLiteralClause *bound2)

{
  Clause *pCVar1;
  pair<Lib::Stack<Kernel::Clause_*>,_Kernel::Substitution> *ppVar2;
  int iVar3;
  TypedTermList *pTVar4;
  Literal *pLVar5;
  Term *t;
  TermLiteralClause *pTVar6;
  TypedTermList *pTVar7;
  uint uVar8;
  TermList arg2;
  pair<Lib::Stack<Kernel::Clause_*>,_Kernel::Substitution> *kv;
  pair<Lib::Stack<Kernel::Clause_*>,_Kernel::Substitution> *cls;
  
  arg2._content = (uint64_t)bound2;
  if (resolveClauses(Inferences::InductionContext,Indexing::InductionFormulaIndex::Entry*,Indexing::TermLiteralClause_const*,Indexing::TermLiteralClause_const*)
      ::less == '\0') {
    iVar3 = __cxa_guard_acquire(&resolveClauses(Inferences::InductionContext,Indexing::InductionFormulaIndex::Entry*,Indexing::TermLiteralClause_const*,Indexing::TermLiteralClause_const*)
                                 ::less);
    if (iVar3 != 0) {
      resolveClauses::less = Kernel::Signature::getInterpretingSymbol(DAT_00a14190,INT_LESS);
      __cxa_guard_release(&resolveClauses(Inferences::InductionContext,Indexing::InductionFormulaIndex::Entry*,Indexing::TermLiteralClause_const*,Indexing::TermLiteralClause_const*)
                           ::less);
    }
  }
  if (resolveClauses(Inferences::InductionContext,Indexing::InductionFormulaIndex::Entry*,Indexing::TermLiteralClause_const*,Indexing::TermLiteralClause_const*)
      ::ph == '\0') {
    iVar3 = __cxa_guard_acquire(&resolveClauses(Inferences::InductionContext,Indexing::InductionFormulaIndex::Entry*,Indexing::TermLiteralClause_const*,Indexing::TermLiteralClause_const*)
                                 ::ph);
    if (iVar3 != 0) {
      t = getPlaceholderForTerm(&context->_indTerms,0);
      Kernel::TypedTermList::TypedTermList(&resolveClauses::ph,t);
      __cxa_guard_release(&resolveClauses(Inferences::InductionContext,Indexing::InductionFormulaIndex::Entry*,Indexing::TermLiteralClause_const*,Indexing::TermLiteralClause_const*)
                           ::ph);
    }
  }
  if (bound1 != (TermLiteralClause *)0x0) {
    pCVar1 = bound1->clause;
    uVar8 = (uint)(bound1->literal->super_Term)._args[0]._content >> 2 & 1;
    pTVar4 = &resolveClauses::ph;
    pTVar6 = bound1;
    if (uVar8 == 0) {
      pTVar6 = (TermLiteralClause *)&resolveClauses::ph;
    }
    if (uVar8 == 0) {
      pTVar4 = &bound1->term;
    }
    pLVar5 = Kernel::Literal::create2
                       ((Literal *)(ulong)resolveClauses::less,uVar8,
                        SUB81((pTVar6->term).super_TermList._content,0),
                        (TermList)(((TermLiteralClause *)pTVar4)->term).super_TermList._content,arg2
                       );
    InductionContext::insert(context,pCVar1,pLVar5);
  }
  if (bound2 != (TermLiteralClause *)0x0) {
    pCVar1 = bound2->clause;
    uVar8 = (uint)(bound2->literal->super_Term)._args[0]._content >> 2 & 1;
    pTVar4 = &resolveClauses::ph;
    pTVar7 = &resolveClauses::ph;
    if (uVar8 == 0) {
      pTVar7 = &bound2->term;
    }
    if (uVar8 != 0) {
      pTVar4 = &bound2->term;
    }
    pLVar5 = Kernel::Literal::create2
                       ((Literal *)(ulong)resolveClauses::less,uVar8,
                        SUB81((((TermLiteralClause *)pTVar7)->term).super_TermList._content,0),
                        (TermList)(((TermLiteralClause *)pTVar4)->term).super_TermList._content,arg2
                       );
    InductionContext::insert(context,pCVar1,pLVar5);
  }
  ppVar2 = (e->_st)._cursor;
  for (cls = (e->_st)._stack; cls != ppVar2; cls = cls + 1) {
    resolveClauses(this,&cls->first,context,&cls->second,
                   bound1 == (TermLiteralClause *)0x0 && bound2 == (TermLiteralClause *)0x0,
                   (Substitution *)0x0);
  }
  return;
}

Assistant:

void InductionClauseIterator::resolveClauses(InductionContext context, InductionFormulaIndex::Entry* e, const TermLiteralClause* bound1, const TermLiteralClause* bound2)
{
  static unsigned less = env.signature->getInterpretingSymbol(Theory::INT_LESS);
  ASS_EQ(context._indTerms.size(), 1);
  static TypedTermList ph(getPlaceholderForTerm(context._indTerms,0));
  // lower bound
  if (bound1) {
    auto lhs = bound1->literal->polarity() ? bound1->term : ph;
    auto rhs = bound1->literal->polarity() ? ph : bound1->term;
    context.insert(bound1->clause,
      Literal::create2(less, bound1->literal->polarity(), lhs, rhs));
  }
  // upper bound
  if (bound2) {
    auto lhs = bound2->literal->polarity() ? ph : bound2->term;
    auto rhs = bound2->literal->polarity() ? bound2->term : ph;
    context.insert(bound2->clause,
      Literal::create2(less, bound2->literal->polarity(), lhs, rhs));
  }
  // true if we have a default bound
  bool applySubst = !bound1 && !bound2;
  for (auto& kv : e->get()) {
    resolveClauses(kv.first, context, kv.second, applySubst);
  }
}